

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderQualifiers.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderFlatInterpolationTest::initProgram(GeometryShaderFlatInterpolationTest *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  char *local_a0;
  char *vs_code_specialized_raw;
  string vs_code_specialized;
  char *gs_code_specialized_raw;
  undefined1 local_60 [8];
  string gs_code_specialized;
  char *fs_code_specialized_raw;
  string fs_code_specialized;
  Functions *gl;
  GeometryShaderFlatInterpolationTest *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  fs_code_specialized.field_2._8_8_ = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  GVar3 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar3;
  GVar3 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderQualifiers.cpp"
                  ,0x74);
  GVar3 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x3c8))();
  this->m_po_id = GVar3;
  dVar4 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderQualifiers.cpp"
                  ,0x79);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&fs_code_specialized_raw,&this->super_TestCaseBase,1,
             &initProgram::fs_code_raw);
  gs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)local_60,&this->super_TestCaseBase,1,&initProgram::gs_code_raw);
  vs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&vs_code_specialized_raw,&this->super_TestCaseBase,1,
             &initProgram::vs_code_raw);
  local_a0 = (char *)std::__cxx11::string::c_str();
  (**(code **)(fs_code_specialized.field_2._8_8_ + 0x14c8))
            (this->m_po_id,1,&initProgram::po_varying,0x8c8c);
  dVar4 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderQualifiers.cpp"
                  ,0xb3);
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_gs_id,1,
                     (char **)((long)&vs_code_specialized.field_2 + 8),this->m_vs_id,1,&local_a0,
                     this->m_fs_id,1,(char **)((long)&gs_code_specialized.field_2 + 8),(bool *)0x0);
  if (!bVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not build test program object",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderQualifiers.cpp"
               ,0xba);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::~string((string *)&vs_code_specialized_raw);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)&fs_code_specialized_raw);
  return;
}

Assistant:

void GeometryShaderFlatInterpolationTest::initProgram()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Create the program object */
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Set the test program object up */
	static const char* fs_code_raw = "${VERSION}\n"
									 "\n"
									 "precision highp float;\n"
									 "\n"
									 "out vec4 result;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    result = vec4(1.0);\n"
									 "}\n";

	static const char* gs_code_raw = "${VERSION}\n"
									 "${GEOMETRY_SHADER_REQUIRE}\n"
									 "\n"
									 "layout(triangles)                in;\n"
									 "layout(points, max_vertices = 1) out;\n"
									 "\n"
									 "flat in int out_vertex[];\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    if (out_vertex[0] != 0 || out_vertex[1] != 1 || out_vertex[2] != 2)\n"
									 "    {\n"
									 "        gl_Position = vec4(0.0);\n"
									 "    }\n"
									 "    else\n"
									 "    {\n"
									 "        gl_Position = vec4(1.0);\n"
									 "    }\n"
									 "    EmitVertex();\n"
									 "}\n";

	static const char* po_varying  = "gl_Position";
	static const char* vs_code_raw = "${VERSION}\n"
									 "\n"
									 "flat out int out_vertex;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    gl_Position = vec4(0.0);\n"
									 "    out_vertex  = gl_VertexID;\n"
									 "}\n";

	std::string fs_code_specialized = TestCaseBase::specializeShader(1, /* parts */
																	 &fs_code_raw);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();
	std::string gs_code_specialized		= TestCaseBase::specializeShader(1, /* parts */
																	 &gs_code_raw);
	const char* gs_code_specialized_raw = gs_code_specialized.c_str();
	std::string vs_code_specialized		= TestCaseBase::specializeShader(1, /* parts */
																	 &vs_code_raw);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	gl.transformFeedbackVaryings(m_po_id, 1, /* count */
								 &po_varying, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

	if (!TestCaseBase::buildProgram(m_po_id, m_gs_id, 1,				  /* n_sh1_body_parts */
									&gs_code_specialized_raw, m_vs_id, 1, /* n_sh2_body_parts */
									&vs_code_specialized_raw, m_fs_id, 1, /* n_sh3_body_parts */
									&fs_code_specialized_raw))
	{
		TCU_FAIL("Could not build test program object");
	}
}